

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O3

void __thiscall MdParser::parse(MdParser *this)

{
  undefined1 *puVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  Document *this_00;
  istream *piVar7;
  Paragraph *pPVar8;
  long lVar9;
  CodeLineElement *this_01;
  code *pcVar10;
  Paragraph *this_02;
  ulong uVar11;
  ulong uVar12;
  string line;
  smatch match;
  regex olist1_regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  MdParser *local_110;
  long *local_108;
  ulong local_100;
  long local_f8 [2];
  string local_e8;
  code *local_c8;
  LineElement *local_c0;
  code *local_b8;
  code *local_b0;
  code *local_a8;
  code *local_a0;
  code *local_98;
  code *local_90;
  code *local_88;
  code *local_80;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  this_00 = (Document *)operator_new(0x38);
  Document::Document(this_00,(string *)&this->field_0x8);
  *(Document **)&this->field_0x230 = this_00;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_begin._M_current = (char *)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"^[0-9]+\\) ",0x10);
  puVar1 = &this->field_0x28;
  pPVar8 = (Paragraph *)0x0;
  local_c8 = wresize;
  local_80 = __cxa_pure_virtual;
  local_b0 = memcpy;
  local_b8 = (code *)&boost::program_options::error_with_option_name::vtable;
  local_90 = std::istream::_M_extract<long>;
  local_a0 = wattr_on;
  local_a8 = DisplayDriver::DisplayDriver;
  local_98 = std::locale::id::_M_id;
  local_88 = wattr_get;
  local_c0 = (LineElement *)0x0;
  local_110 = this;
LAB_00123a06:
  do {
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)puVar1 + -0x18) + (char)puVar1);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)puVar1,(string *)&local_e8,cVar4);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        if ((pPVar8 != (Paragraph *)0x0) && (lVar9 = Paragraph::size(), lVar9 != 0)) {
          Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
        if (local_78.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      if (local_e8._M_string_length != 0) break;
      if ((pPVar8 != (Paragraph *)0x0) && (lVar9 = Paragraph::size(), lVar9 != 0)) {
        Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
      }
      pPVar8 = (Paragraph *)operator_new(0x28);
      *(undefined8 *)(pPVar8 + 0x10) = 0;
      *(undefined8 *)(pPVar8 + 0x18) = 0;
      *(undefined8 *)pPVar8 = 0;
      *(undefined8 *)(pPVar8 + 8) = 0;
      *(undefined8 *)(pPVar8 + 0x20) = 0;
      Paragraph::Paragraph(pPVar8);
LAB_00124004:
      *(code **)pPVar8 = local_c8;
    }
    uVar12 = 0;
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
      if (local_e8._M_string_length <= uVar11) break;
    } while (local_e8._M_dataplus._M_p[uVar11] == '#');
    if (pPVar8 == (Paragraph *)0x0) {
      pPVar8 = (Paragraph *)operator_new(0x28);
      *(undefined8 *)(pPVar8 + 0x10) = 0;
      *(undefined8 *)(pPVar8 + 0x18) = 0;
      *(undefined8 *)pPVar8 = 0;
      *(undefined8 *)(pPVar8 + 8) = 0;
      *(undefined8 *)(pPVar8 + 0x20) = 0;
      Paragraph::Paragraph(pPVar8);
      *(code **)pPVar8 = local_c8;
    }
    std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
    iVar6 = std::__cxx11::string::compare((char *)&local_130);
    if ((iVar6 == 0) || (*local_e8._M_dataplus._M_p == '\t')) {
      lVar9 = Paragraph::size();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      if (lVar9 == 0) {
        Paragraph::~Paragraph(pPVar8);
        operator_delete(pPVar8,0x28);
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        *(code **)pPVar8 = local_80;
        std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
        iVar6 = std::__cxx11::string::compare((char *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        if (iVar6 == 0) {
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
        }
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        this_01 = (CodeLineElement *)operator_new(0x28);
        CodeLineElement::CodeLineElement(this_01,(string *)&local_e8);
        (*(code *)**(undefined8 **)pPVar8)(pPVar8,this_01);
        Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
        pPVar8 = (Paragraph *)operator_new(0x28);
        *(undefined8 *)(pPVar8 + 0x10) = 0;
        *(undefined8 *)(pPVar8 + 0x18) = 0;
        *(undefined8 *)pPVar8 = 0;
        *(undefined8 *)(pPVar8 + 8) = 0;
        *(undefined8 *)(pPVar8 + 0x20) = 0;
        Paragraph::Paragraph(pPVar8);
        goto LAB_00124004;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    if (uVar12 != 1) {
      local_108 = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"\t #","");
      lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_e8,(ulong)local_108,0);
      if (lVar9 == -1) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        local_130._M_string_length = 0;
        local_130.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
      }
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      if (uVar11 == 1) {
        Paragraph::~Paragraph(pPVar8);
        operator_delete(pPVar8,0x28);
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        pcVar10 = local_b0;
LAB_00124078:
        *(code **)pPVar8 = pcVar10;
      }
      else {
        if (uVar11 == 2) {
          Paragraph::~Paragraph(pPVar8);
          operator_delete(pPVar8,0x28);
          pPVar8 = (Paragraph *)operator_new(0x28);
          Paragraph::Paragraph(pPVar8);
          pcVar10 = local_b8;
          goto LAB_00124078;
        }
        if (uVar12 == 4) {
          Paragraph::~Paragraph(pPVar8);
          operator_delete(pPVar8,0x28);
          pPVar8 = (Paragraph *)operator_new(0x28);
          Paragraph::Paragraph(pPVar8);
          pcVar10 = local_88;
          goto LAB_00124078;
        }
      }
      parse_line(local_110,pPVar8,&local_e8);
      goto LAB_00123a06;
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,">","");
    if (local_e8._M_string_length < local_130._M_string_length) {
LAB_00123db1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      uVar12 = 0;
      do {
        uVar11 = uVar12 + 1;
        if (local_130._M_string_length <= uVar12) break;
        pcVar2 = local_130._M_dataplus._M_p + uVar12;
        pcVar3 = local_e8._M_dataplus._M_p + uVar12;
        uVar12 = uVar11;
      } while (*pcVar3 == *pcVar2);
      if (local_130._M_string_length + 1 != uVar11) goto LAB_00123db1;
      lVar9 = Paragraph::size();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      if (lVar9 == 0) {
        Paragraph::~Paragraph(pPVar8);
        operator_delete(pPVar8,0x28);
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        *(code **)pPVar8 = local_98;
        std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
        lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_130,0x133df7,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        if (lVar9 == -1) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130," ","");
          parse_line(local_110,pPVar8,&local_130);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
          parse_line(local_110,pPVar8,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
        pPVar8 = (Paragraph *)operator_new(0x28);
        *(undefined8 *)(pPVar8 + 0x10) = 0;
        *(undefined8 *)(pPVar8 + 0x18) = 0;
        *(undefined8 *)pPVar8 = 0;
        *(undefined8 *)(pPVar8 + 8) = 0;
        *(undefined8 *)(pPVar8 + 0x20) = 0;
        Paragraph::Paragraph(pPVar8);
        goto LAB_00124004;
      }
    }
    cVar4 = (char)&local_e8;
    lVar9 = std::__cxx11::string::find_first_not_of(cVar4,0x3d);
    if (lVar9 == -1) {
      this_02 = (Paragraph *)operator_new(0x28);
      Paragraph::Paragraph(this_02,pPVar8);
      pcVar10 = local_b0;
LAB_001240b1:
      *(code **)this_02 = pcVar10;
      Paragraph::~Paragraph(pPVar8);
      operator_delete(pPVar8,0x28);
      Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
      pPVar8 = (Paragraph *)0x0;
    }
    else {
      lVar9 = std::__cxx11::string::find_first_not_of(cVar4,0x2d);
      if (lVar9 == -1) {
        this_02 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(this_02,pPVar8);
        pcVar10 = local_b8;
        goto LAB_001240b1;
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"* ","");
      if (local_e8._M_string_length < local_130._M_string_length) {
LAB_00123e56:
        local_108 = local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"- ","");
        if (local_e8._M_string_length < local_100) {
          bVar5 = false;
        }
        else {
          uVar12 = 0;
          do {
            uVar11 = uVar12 + 1;
            if (local_100 <= uVar12) break;
            pcVar2 = (char *)((long)local_108 + uVar12);
            pcVar3 = local_e8._M_dataplus._M_p + uVar12;
            uVar12 = uVar11;
          } while (*pcVar3 == *pcVar2);
          bVar5 = local_100 + 1 == uVar11;
        }
        if (local_108 != local_f8) {
          operator_delete(local_108,local_f8[0] + 1);
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar11 = uVar12 + 1;
          if (local_130._M_string_length <= uVar12) break;
          pcVar2 = local_130._M_dataplus._M_p + uVar12;
          pcVar3 = local_e8._M_dataplus._M_p + uVar12;
          uVar12 = uVar11;
        } while (*pcVar3 == *pcVar2);
        bVar5 = true;
        if (local_130._M_string_length + 1 != uVar11) goto LAB_00123e56;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      if (bVar5) {
        lVar9 = Paragraph::size();
        if (lVar9 != 0) {
          Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
        }
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        *(code **)pPVar8 = local_90;
        std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
        parse_line(local_110,pPVar8,&local_130);
LAB_001243b5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"  * ","");
        if (local_e8._M_string_length < local_130._M_string_length) {
LAB_00124208:
          local_108 = local_f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"  - ","");
          if (local_e8._M_string_length < local_100) {
            bVar5 = false;
          }
          else {
            uVar12 = 0;
            do {
              uVar11 = uVar12 + 1;
              if (local_100 <= uVar12) break;
              pcVar2 = (char *)((long)local_108 + uVar12);
              pcVar3 = local_e8._M_dataplus._M_p + uVar12;
              uVar12 = uVar11;
            } while (*pcVar3 == *pcVar2);
            bVar5 = local_100 + 1 == uVar11;
          }
          if (local_108 != local_f8) {
            operator_delete(local_108,local_f8[0] + 1);
          }
        }
        else {
          uVar12 = 0;
          do {
            uVar11 = uVar12 + 1;
            if (local_130._M_string_length <= uVar12) break;
            pcVar2 = local_130._M_dataplus._M_p + uVar12;
            pcVar3 = local_e8._M_dataplus._M_p + uVar12;
            uVar12 = uVar11;
          } while (*pcVar3 == *pcVar2);
          bVar5 = true;
          if (local_130._M_string_length + 1 != uVar11) goto LAB_00124208;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
        if (bVar5) {
          lVar9 = Paragraph::size();
          if (lVar9 != 0) {
            Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
          }
          pPVar8 = (Paragraph *)operator_new(0x28);
          Paragraph::Paragraph(pPVar8);
          *(code **)pPVar8 = local_a0;
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
          parse_line(local_110,pPVar8,&local_130);
          goto LAB_001243b5;
        }
        bVar5 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_e8._M_dataplus._M_p,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_e8._M_dataplus._M_p + local_e8._M_string_length),&local_78,
                           &local_50,0);
        if (bVar5) {
          lVar9 = Paragraph::size();
          if (lVar9 != 0) {
            Document::append_paragraph(*(Paragraph **)&local_110->field_0x230);
          }
          pPVar8 = (Paragraph *)operator_new(0x28);
          Paragraph::Paragraph(pPVar8);
          *(code **)pPVar8 = local_a8;
          std::__cxx11::string::find_first_not_of((char *)&local_e8,0x133dff,0);
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_e8);
          parse_line(local_110,pPVar8,&local_130);
          goto LAB_001243b5;
        }
        lVar9 = Paragraph::size();
        if (local_c0 != (LineElement *)0x0 && lVar9 != 0) {
          (**(code **)(*(long *)local_c0 + 0x10))(&local_130);
          if (local_130._M_dataplus._M_p[local_130._M_string_length - 1] == ' ') {
            bVar5 = false;
          }
          else {
            bVar5 = *local_e8._M_dataplus._M_p != ' ';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,
                            CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                     local_130.field_2._M_local_buf[0]) + 1);
          }
          if (bVar5) {
            std::operator+(&local_130," ",&local_e8);
            std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,
                              CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                       local_130.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        local_c0 = parse_line(local_110,pPVar8,&local_e8);
      }
    }
  } while( true );
}

Assistant:

void MdParser::parse() {
	std::string line;
	_document = new Document(_filename);
	Paragraph *current_p(nullptr), *temp_p(nullptr);
	LineElement *last_e = nullptr;
	size_t sharps(0);

	smatch match;
	regex olist1_regex("^[0-9]+\\) ");

	while (getline(_input_file, line)) {
		if (line.empty()) {
			// end of line, change paragraph
			if (current_p and current_p->size()) {
				_document->append_paragraph(current_p);
			}
			current_p = new TextParagraph();
		} else {
			sharps = string_startswith(line, '#');

			if (!current_p) {
				current_p = new TextParagraph();
			}

			if ( (line.substr(0, 4) == "    " or line[0] == '\t') and (!current_p or !current_p->size()) ) {
				// This is a code paragraph
				delete current_p;
				current_p = new CodeParagraph();
				if (line.substr(0, 4) == "    ") {
					line = line.substr(4);
				} else {
					line = line.substr(1);
				}
				current_p->append_line_element(new CodeLineElement(line));
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (sharps != 0) {
				line = string_clear_leading(line, "\t #");
				switch(sharps) {
					case 1:
						delete current_p;
						current_p = new Title1Paragraph();
						break;
					case 2:
						delete current_p;
						current_p = new Title2Paragraph();
						break;
					case 3:
						delete current_p;
						current_p = new Title3Paragraph();
						break;
					default:
						break;
				}
				parse_line(current_p, line);
			} else if (string_startswith(line, ">") and (!current_p or !current_p->size())) {
				delete current_p;
				current_p = new QuoteParagraph();
				if (line.substr(1).find_first_not_of("\t ") == string::npos) {
					parse_line(current_p, " ");
				} else {
					parse_line(current_p, line.substr(2));
				}
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (string_has_only(line, '=')) { // title 1 delimiter
				temp_p = new Title1Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_has_only(line, '-')) { // title 2 delimiter
				temp_p = new Title2Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_startswith(line, "* ") or string_startswith(line, "- ")) { // level 1 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList1Paragraph();
				parse_line(current_p, line.substr(2));
			} else if (string_startswith(line, "  * ") or string_startswith(line, "  - ")) { // level 2 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList2Paragraph();
				parse_line(current_p, line.substr(4));
			} else if (regex_search(line, match, olist1_regex)) { // ordered list level 1
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new OList1Paragraph();
				parse_line(current_p, line.substr(line.find_first_not_of("0123456789)")+1));
			} else {
				// other content
				if (current_p->size() && last_e && (last_e->content()).back() != ' ' && line.front() != ' ') {
					line = " "+line;
				}
				last_e = parse_line(current_p, line);
			}
		}
	}

	if (current_p and current_p->size()) {
		_document->append_paragraph(current_p);
	}
}